

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void fts5MultiIterNew(Fts5Index *p,Fts5Structure *pStruct,int flags,Fts5Colset *pColset,u8 *pTerm,
                     int nTerm,int iLevel,int nSegment,Fts5Iter **ppOut)

{
  Fts5Hash *p_00;
  Fts5Buffer *pFVar1;
  bool bVar2;
  Fts5Data *p_01;
  Fts5Iter *pFVar3;
  Fts5Iter *pIter;
  u8 *puVar4;
  byte bVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  Fts5Data *pFVar9;
  size_t sVar10;
  char *zSql;
  Fts5DlidxIter *pFVar11;
  Fts5Data *pFVar12;
  ushort uVar13;
  uint uVar14;
  long lVar15;
  long lVar16;
  u32 uVar17;
  ulong uVar18;
  Fts5StructureSegment *pFVar19;
  ulong uVar20;
  Fts5SegIter *pFVar21;
  int iVar22;
  Fts5Index *pFVar23;
  uint uVar24;
  undefined4 in_register_0000008c;
  int *piVar25;
  u32 uVar26;
  u8 *puVar27;
  sqlite3_stmt *p_02;
  ulong uVar28;
  Fts5HashEntry *p_03;
  Fts5StructureLevel *pFVar29;
  bool bVar30;
  int nList;
  byte local_e1;
  Fts5Index *local_e0;
  int *local_d8;
  uint local_cc;
  Fts5SegIter *local_c8;
  Fts5Iter *local_c0;
  uint local_b4;
  int local_b0;
  u32 local_ac;
  u8 *local_a8;
  u32 nKeep;
  undefined4 uStack_9c;
  u8 *z;
  undefined8 local_90;
  Fts5HashEntry *local_88;
  Fts5StructureLevel *local_80;
  Fts5Buffer *local_78;
  int local_6c;
  int local_68;
  u32 local_64;
  undefined1 *local_60;
  ulong local_58;
  sqlite3_stmt **local_50;
  Fts5Iter **local_48;
  long local_40;
  Fts5SegIter *local_38;
  
  local_90 = CONCAT44(in_register_0000008c,nTerm);
  uVar18 = 0;
  local_88 = (Fts5HashEntry *)(ulong)(uint)iLevel;
  if (p->rc == 0) {
    if (iLevel < 0) {
      uVar18 = (ulong)((pStruct->nSegment + 1) - (uint)(p->pHash == (Fts5Hash *)0x0));
    }
    else {
      uVar6 = pStruct->aLevel[(long)local_88].nSeg;
      if ((int)uVar6 < nSegment) {
        nSegment = uVar6;
      }
      uVar18 = (ulong)(uint)nSegment;
    }
  }
  local_e0 = p;
  local_cc = flags;
  local_a8 = pTerm;
  local_c0 = fts5MultiIterAlloc(p,(int)uVar18);
  *ppOut = local_c0;
  if (local_c0 != (Fts5Iter *)0x0) {
    local_48 = ppOut;
    piVar25 = &p->rc;
    local_c0->bRev = local_cc >> 1 & 1;
    local_c0->bSkipEmpty = (byte)(local_cc >> 4) & 1;
    local_c0->pColset = pColset;
    if ((local_cc & 0x20) == 0) {
      fts5IterSetOutputCb(piVar25,local_c0);
    }
    pFVar23 = local_e0;
    if (*piVar25 == 0) {
      pFVar29 = pStruct->aLevel;
      local_d8 = piVar25;
      if (iLevel < 0) {
        local_60 = (undefined1 *)((long)pStruct->nLevel << 4);
        p_00 = local_e0->pHash;
        if (p_00 == (Fts5Hash *)0x0) {
          local_b4 = local_cc & 8;
          lVar15 = 0;
        }
        else {
          nList = 0;
          z = (u8 *)0x0;
          local_b4 = local_cc & 8;
          iVar22 = (int)local_90;
          local_80 = pFVar29;
          if (local_b4 == 0 && local_a8 != (u8 *)0x0) {
            uVar6 = fts5HashKey(p_00->nSlot,local_a8,iVar22);
            piVar25 = local_d8;
            p_03 = (Fts5HashEntry *)(p_00->aSlot + uVar6);
            do {
              p_03 = p_03->pHashNext;
              if (p_03 == (Fts5HashEntry *)0x0) {
                iVar8 = 0;
                goto LAB_001b6715;
              }
            } while ((p_03->nKey + 1 != iVar22) ||
                    (iVar8 = bcmp(p_03 + 1,local_a8,(long)iVar22), iVar8 != 0));
            iVar22 = iVar22 + 0x31;
            iVar8 = p_03->nData;
            pFVar9 = (Fts5Data *)sqlite3_malloc64(((long)iVar8 - (long)iVar22) + 0x1a);
            if (pFVar9 == (Fts5Data *)0x0) {
              iVar8 = 7;
              piVar25 = local_d8;
              iVar22 = (int)local_90;
LAB_001b6715:
              nList = 0;
              *piVar25 = iVar8;
              pFVar9 = (Fts5Data *)0x0;
            }
            else {
              iVar8 = iVar8 - iVar22;
              local_88 = (Fts5HashEntry *)((long)&pFVar9->p + (long)(-0x21 - (int)local_90));
              memcpy(pFVar9 + 1,(void *)((long)&p_03->pHashNext + (long)iVar22),(long)iVar8);
              iVar22 = fts5HashAddPoslistSize(p_00,p_03,local_88);
              nList = iVar8 + iVar22;
              *local_d8 = 0;
              pFVar9->p = (u8 *)(pFVar9 + 1);
              iVar22 = (int)local_90;
              pFVar23 = local_e0;
            }
            z = local_a8;
            piVar25 = &local_c0->aSeg[0].flags;
            *(byte *)piVar25 = (byte)*piVar25 | 1;
            puVar27 = local_a8;
          }
          else {
            _nKeep = (u8 *)0x0;
            iVar22 = sqlite3Fts5HashScanInit(p_00,(char *)local_a8,iVar22);
            pFVar23->rc = iVar22;
            sqlite3Fts5HashScanEntry(pFVar23->pHash,(char **)&z,(u8 **)&nKeep,&nList);
            puVar27 = z;
            if (z == (u8 *)0x0) {
              iVar22 = 0;
            }
            else {
              sVar10 = strlen((char *)z);
              iVar22 = (int)sVar10;
            }
            puVar4 = _nKeep;
            if ((_nKeep == (u8 *)0x0) ||
               (pFVar9 = (Fts5Data *)sqlite3Fts5MallocZero(local_d8,0x10), pFVar9 == (Fts5Data *)0x0
               )) {
              pFVar9 = (Fts5Data *)0x0;
            }
            else {
              pFVar9->p = puVar4;
            }
          }
          pFVar3 = local_c0;
          pFVar21 = local_c0->aSeg;
          if (pFVar9 != (Fts5Data *)0x0) {
            sqlite3Fts5BufferSet(local_d8,&local_c0->aSeg[0].term,iVar22,puVar27);
            pFVar9->szLeaf = nList;
            pFVar9->nn = nList;
            pFVar3->aSeg[0].pLeaf = pFVar9;
            bVar5 = sqlite3Fts5GetVarint(pFVar9->p,(u64 *)&pFVar3->aSeg[0].iRowid);
            pFVar3->aSeg[0].iLeafOffset = (uint)bVar5;
            pFVar3->aSeg[0].iEndofDoclist = pFVar9->nn;
            if ((local_cc & 2) == 0) {
              fts5SegIterLoadNPos(pFVar23,pFVar21);
            }
            else {
              piVar25 = &pFVar3->aSeg[0].flags;
              *(byte *)piVar25 = (byte)*piVar25 | 2;
              fts5SegIterReverseInitPage(pFVar23,pFVar21);
            }
          }
          fts5SegIterSetNext(pFVar23,pFVar21);
          lVar15 = 1;
          pFVar29 = local_80;
        }
        local_60 = (undefined1 *)((long)&pFVar29->nMerge + (long)local_60);
        local_38 = local_c0->aSeg;
        local_50 = &pFVar23->pIdxSelect;
        for (; pFVar29 < local_60; pFVar29 = pFVar29 + 1) {
          uVar18 = (ulong)(uint)pFVar29->nSeg;
          lVar15 = (long)(int)lVar15;
          piVar25 = local_d8;
          local_80 = pFVar29;
LAB_001b6835:
          while (0 < (int)uVar18) {
            uVar18 = uVar18 - 1;
            pFVar19 = pFVar29->aSeg + uVar18;
            lVar16 = lVar15 + 1;
            pFVar21 = local_38 + lVar15;
            lVar15 = lVar16;
            if (local_a8 == (u8 *)0x0) goto LAB_001b69d6;
            pFVar21->iRowid = 0;
            pFVar21->nPos = 0;
            pFVar21->bDel = '\0';
            *(undefined3 *)&pFVar21->field_0x75 = 0;
            (pFVar21->term).p = (u8 *)0x0;
            (pFVar21->term).n = 0;
            (pFVar21->term).nSpace = 0;
            pFVar21->aRowidOffset = (int *)0x0;
            pFVar21->pDlidx = (Fts5DlidxIter *)0x0;
            pFVar21->iPgidxOff = 0;
            pFVar21->iEndofDoclist = 0;
            pFVar21->iRowidOffset = 0;
            pFVar21->nRowidOffset = 0;
            pFVar21->xNext = (_func_void_Fts5Index_ptr_Fts5SegIter_ptr_int_ptr *)0x0;
            pFVar21->iTermLeafPgno = 0;
            pFVar21->iTermLeafOffset = 0;
            pFVar21->pNextLeaf = (Fts5Data *)0x0;
            *(undefined8 *)&pFVar21->iLeafOffset = 0;
            pFVar21->flags = 0;
            pFVar21->iLeafPgno = 0;
            pFVar21->pLeaf = (Fts5Data *)0x0;
            pFVar21->pSeg = pFVar19;
            p_02 = *local_50;
            local_c8 = pFVar21;
            if (p_02 == (sqlite3_stmt *)0x0) {
              zSql = sqlite3_mprintf("SELECT pgno FROM \'%q\'.\'%q_idx\' WHERE segid=? AND term<=? ORDER BY term DESC LIMIT 1"
                                     ,pFVar23->pConfig->zDb,pFVar23->pConfig->zName);
              fts5IndexPrepareStmt(pFVar23,local_50,zSql);
              p_02 = pFVar23->pIdxSelect;
            }
            if (*piVar25 == 0) {
              iVar8 = 1;
              local_58 = uVar18;
              local_40 = lVar16;
              sqlite3_bind_int(p_02,1,pFVar19->iSegid);
              sqlite3_bind_blob(p_02,2,local_a8,(int)local_90,(_func_void_void_ptr *)0x0);
              iVar22 = sqlite3_step(p_02);
              bVar30 = true;
              if (iVar22 == 100) {
                uVar6 = sqlite3_column_int(p_02,0);
                iVar8 = (int)uVar6 >> 1;
                bVar30 = (uVar6 & 1) == 0;
              }
              local_e1 = bVar30;
              iVar22 = sqlite3_reset(p_02);
              pFVar23->rc = iVar22;
              sqlite3_bind_null(p_02,2);
              pFVar21 = local_c8;
              local_6c = pFVar19->pgnoFirst;
              iVar22 = local_6c;
              if (local_6c < iVar8) {
                iVar22 = iVar8;
              }
              local_c8->iLeafPgno = iVar22 + -1;
              local_68 = iVar8;
              fts5SegIterNextPage(pFVar23,local_c8);
              pFVar1 = (Fts5Buffer *)pFVar21->pLeaf;
              if (pFVar1 != (Fts5Buffer *)0x0) {
                puVar27 = pFVar1->p;
                iVar22 = pFVar1->nSpace;
                iVar8 = pFVar1->n;
                _nKeep = (u8 *)((ulong)_nKeep & 0xffffffff00000000);
                local_78 = pFVar1;
                iVar7 = sqlite3Fts5GetVarint32(puVar27 + iVar22,&local_ac);
                local_b0 = iVar8;
                if (iVar8 < (int)local_ac) {
                  *piVar25 = 0x10b;
                  pFVar23 = local_e0;
                  pFVar29 = local_80;
                }
                else {
                  iVar7 = iVar7 + iVar22;
                  uVar17 = local_ac;
                  uVar6 = 0;
                  uVar26 = local_ac;
LAB_001b69f7:
                  nList = (int)puVar27[(int)uVar17];
                  local_88 = (Fts5HashEntry *)CONCAT44(local_88._4_4_,iVar7);
                  if ((char)puVar27[(int)uVar17] < '\0') {
                    iVar22 = sqlite3Fts5GetVarint32(puVar27 + (int)uVar17,(u32 *)&nList);
                    iVar22 = uVar17 + iVar22;
                  }
                  else {
                    iVar22 = uVar17 + 1;
                  }
                  iVar8 = local_b0;
                  piVar25 = local_d8;
                  pFVar23 = local_e0;
                  uVar17 = nKeep;
                  if (nKeep < uVar6) {
LAB_001b6bca:
                    z = (u8 *)CONCAT44(z._4_4_,iVar22);
                    uVar6 = uVar17;
                    local_ac = uVar26;
                    if (local_b4 != 0) goto LAB_001b6be8;
LAB_001b6c73:
                    z = (u8 *)CONCAT44(z._4_4_,iVar22);
                    sqlite3_free(local_78);
                    local_c8->pLeaf = (Fts5Data *)0x0;
                    pFVar21 = local_c8;
                    pFVar29 = local_80;
                    goto LAB_001b6ccb;
                  }
                  uVar24 = uVar6;
                  if (nKeep == uVar6) {
                    uVar14 = (uint)local_90 - uVar6;
                    if ((uint)nList < uVar14) {
                      uVar14 = nList;
                    }
                    uVar18 = 0;
                    do {
                      if (uVar14 == uVar18) goto LAB_001b6a66;
                      iVar7 = (int)uVar18;
                      uVar18 = uVar18 + 1;
                    } while (puVar27[(uint)(iVar22 + iVar7)] == local_a8[uVar6 + iVar7]);
                    uVar14 = (int)uVar18 - 1;
LAB_001b6a66:
                    uVar24 = uVar14 + uVar6;
                    uVar17 = uVar6;
                    if (uVar24 == (uint)local_90) {
                      if (uVar14 != nList) goto LAB_001b6bca;
                      z = (u8 *)CONCAT44(z._4_4_,iVar22);
                      local_ac = uVar26;
                      goto LAB_001b6be8;
                    }
                    if (((uint)nList <= uVar14) || (puVar27[uVar14 + iVar22] <= local_a8[uVar24]))
                    goto LAB_001b6a95;
                    goto LAB_001b6bca;
                  }
LAB_001b6a95:
                  iVar7 = (int)local_88;
                  if (local_b0 <= (int)local_88) {
                    z = (u8 *)CONCAT44(z._4_4_,iVar22);
                    if (local_b4 == 0) goto LAB_001b6c73;
                    goto LAB_001b6b13;
                  }
                  iVar22 = sqlite3Fts5GetVarint32(puVar27 + (int)local_88,&nKeep);
                  uVar26 = uVar26 + nKeep;
                  if ((int)uVar26 < iVar8) {
                    iVar7 = iVar7 + iVar22;
                    uVar17 = uVar26 + 1;
                    _nKeep = (u8 *)CONCAT44(uStack_9c,(uint)puVar27[(int)uVar26]);
                    uVar6 = uVar24;
                    if ((char)puVar27[(int)uVar26] < '\0') {
                      iVar22 = sqlite3Fts5GetVarint32(puVar27 + (int)uVar26,&nKeep);
                      uVar17 = iVar22 + uVar26;
                    }
                    goto LAB_001b69f7;
                  }
                  *local_d8 = 0x10b;
                  pFVar23 = local_e0;
                  piVar25 = local_d8;
                  pFVar21 = local_c8;
                  pFVar29 = local_80;
                }
              }
              goto LAB_001b6ccb;
            }
          }
        }
      }
      else {
        pFVar29 = pFVar29 + (long)local_88;
        pFVar21 = local_c0->aSeg;
        lVar15 = uVar18 * 0xc;
        while( true ) {
          if ((int)uVar18 < 1) break;
          fts5SegIterInit(pFVar23,(Fts5StructureSegment *)((long)&pFVar29->aSeg[-1].iSegid + lVar15)
                          ,pFVar21);
          pFVar21 = pFVar21 + 1;
          uVar18 = (ulong)((int)uVar18 - 1);
          lVar15 = lVar15 + -0xc;
        }
      }
      pFVar3 = local_c0;
      piVar25 = local_d8;
      if (*local_d8 == 0) {
        iVar22 = local_c0->nSeg;
        while (pIter = local_c0, 1 < iVar22) {
          iVar22 = iVar22 + -1;
          iVar8 = fts5MultiIterDoCompare(local_c0,iVar22);
          if (iVar8 != 0) {
            if (*piVar25 == 0) {
              (*pFVar3->aSeg[iVar8].xNext)(local_e0,pFVar3->aSeg + iVar8,(int *)0x0);
            }
            fts5MultiIterAdvanced(local_e0,local_c0,iVar8,iVar22);
          }
        }
        fts5MultiIterSetEof(local_c0);
        pFVar23 = local_e0;
        if ((pIter->bSkipEmpty != '\0') &&
           (iVar22 = fts5MultiIterIsEmpty(local_e0,pIter), iVar22 != 0)) {
          fts5MultiIterNext(pFVar23,pIter,0,0);
          return;
        }
        if ((pIter->base).bEof != '\0') {
          return;
        }
        (*pIter->xSetOutputs)(pIter,pFVar3->aSeg + pIter->aFirst[1].iFirst);
        return;
      }
    }
    fts5MultiIterFree(local_c0);
    *local_48 = (Fts5Iter *)0x0;
  }
  return;
LAB_001b69d6:
  fts5SegIterInit(pFVar23,pFVar19,pFVar21);
  goto LAB_001b6835;
  while( true ) {
    iVar22 = pFVar9->szLeaf;
    if (iVar22 < pFVar9->nn) break;
LAB_001b6b13:
    pFVar21 = local_c8;
    fts5SegIterNextPage(pFVar23,local_c8);
    pFVar9 = pFVar21->pLeaf;
    pFVar29 = local_80;
    if (pFVar9 == (Fts5Data *)0x0) goto LAB_001b6ccb;
  }
  puVar27 = pFVar9->p;
  local_b0 = pFVar9->nn;
  iVar8 = sqlite3Fts5GetVarint32(puVar27 + iVar22,(u32 *)&z);
  uVar26 = (u32)z;
  if (((long)(int)(u32)z < 4) || (iVar22 <= (int)(u32)z)) {
LAB_001b6c89:
    *piVar25 = 0x10b;
    pFVar21 = local_c8;
    pFVar29 = local_80;
  }
  else {
    _nKeep = (u8 *)((ulong)_nKeep & 0xffffffff00000000);
    local_88 = (Fts5HashEntry *)CONCAT44(local_88._4_4_,iVar8 + iVar22);
    local_ac = (u32)z;
    iVar22 = sqlite3Fts5GetVarint32(puVar27 + (int)(u32)z,(u32 *)&nList);
    iVar22 = iVar22 + uVar26;
    z = (u8 *)CONCAT44(z._4_4_,iVar22);
    uVar6 = 0;
LAB_001b6be8:
    iVar8 = nList;
    iVar7 = nList + iVar22;
    local_c8->iLeafOffset = iVar7;
    if ((nList == 0) || (local_b0 < iVar7)) goto LAB_001b6c89;
    local_c8->iTermLeafOffset = iVar7;
    local_c8->iTermLeafPgno = local_c8->iLeafPgno;
    local_78 = &local_c8->term;
    sqlite3Fts5BufferSet(piVar25,local_78,uVar6,local_a8);
    sqlite3Fts5BufferAppendBlob(piVar25,local_78,iVar8,puVar27 + iVar22);
    iVar22 = (int)local_88;
    if ((int)local_88 < local_b0) {
      iVar7 = sqlite3Fts5GetVarint32(puVar27 + (int)local_88,&local_64);
      iVar8 = uVar26 + local_64;
      iVar22 = iVar22 + iVar7;
    }
    else {
      iVar8 = local_c8->pLeaf->nn + 1;
    }
    pFVar21 = local_c8;
    local_c8->iEndofDoclist = iVar8;
    local_c8->iPgidxOff = iVar22;
    fts5SegIterLoadRowid(pFVar23,local_c8);
    fts5SegIterLoadNPos(pFVar23,pFVar21);
    pFVar29 = local_80;
  }
LAB_001b6ccb:
  uVar18 = local_58;
  if (*piVar25 != 0 || local_b4 != 0) goto LAB_001b6cdd;
  uVar6 = pFVar21->flags;
  uVar24 = uVar6 | 1;
  pFVar21->flags = uVar24;
  if (pFVar21->pLeaf == (Fts5Data *)0x0) goto LAB_001b6cdd;
  if ((local_cc & 2) != 0) {
    uVar24 = uVar6 | 3;
    pFVar21->flags = uVar24;
  }
  if (local_6c <= local_68 && (local_e1 & 1) == 0) {
    if ((pFVar21->iTermLeafPgno != pFVar21->iLeafPgno) ||
       (pFVar21->pLeaf->szLeaf <= pFVar21->iEndofDoclist)) {
      pFVar11 = fts5DlidxIterInit(pFVar23,uVar24 & 2,pFVar21->pSeg->iSegid,pFVar21->iTermLeafPgno);
      pFVar21->pDlidx = pFVar11;
    }
  }
  if ((local_cc & 2) == 0) goto LAB_001b6cdd;
  if (pFVar21->pDlidx == (Fts5DlidxIter *)0x0) {
    uVar28 = (ulong)pFVar21->iLeafPgno;
    iVar22 = 4;
    if (pFVar21->iTermLeafPgno == pFVar21->iLeafPgno) {
      iVar22 = pFVar21->iTermLeafOffset;
    }
    pFVar9 = pFVar21->pLeaf;
    lVar15 = (long)iVar22;
    do {
      lVar16 = lVar15 + 1;
      if (-1 < (char)pFVar9->p[lVar15]) break;
      bVar30 = lVar15 < iVar22 + 8;
      lVar15 = lVar16;
    } while (bVar30);
    local_c8->iLeafOffset = (int)lVar16;
    pFVar21 = local_c8;
    if (pFVar9->szLeaf <= local_c8->iEndofDoclist) {
      pFVar19 = local_c8->pSeg;
      uVar20 = 0;
      pFVar9 = (Fts5Data *)0x0;
      do {
        do {
          iVar22 = (int)uVar20;
          if ((*local_d8 != 0) || ((long)pFVar19->pgnoLast <= (long)uVar28)) goto LAB_001b6d8e;
          pFVar12 = fts5DataRead(pFVar23,uVar28 + ((ulong)(uint)pFVar19->iSegid << 0x25) + 1);
          uVar28 = uVar28 + 1;
        } while (pFVar12 == (Fts5Data *)0x0);
        iVar8 = pFVar12->szLeaf;
        bVar30 = pFVar12->p[1] != '\0';
        bVar2 = *pFVar12->p != '\0';
        iVar7 = pFVar12->nn;
        p_01 = pFVar12;
        if (bVar30 || bVar2) {
          uVar20 = uVar28 & 0xffffffff;
          p_01 = pFVar9;
        }
        iVar22 = (int)uVar20;
        if (bVar30 || bVar2) {
          pFVar9 = pFVar12;
        }
        sqlite3_free(p_01);
        pFVar23 = local_e0;
        uVar18 = local_58;
      } while (iVar7 <= iVar8);
      goto LAB_001b6d8e;
    }
  }
  else {
    iVar22 = pFVar21->pDlidx->aLvl[0].iLeafPgno;
    pFVar9 = fts5DataRead(pFVar23,((ulong)(uint)pFVar21->pSeg->iSegid << 0x25) + (long)iVar22);
LAB_001b6d8e:
    pFVar21 = local_c8;
    piVar25 = local_d8;
    if (pFVar9 != (Fts5Data *)0x0) {
      sqlite3_free(local_c8->pLeaf);
      pFVar21->pLeaf = pFVar9;
      pFVar21->iLeafPgno = iVar22;
      uVar13 = *(ushort *)pFVar9->p;
      uVar13 = uVar13 << 8 | uVar13 >> 8;
      bVar5 = sqlite3Fts5GetVarint
                        ((uchar *)((ulong)uVar13 + (long)pFVar9->p),(u64 *)&pFVar21->iRowid);
      pFVar21->iLeafOffset = (uint)bVar5 + (uint)uVar13;
      if (pFVar9->szLeaf < pFVar9->nn) {
        iVar22 = fts5LeafFirstTermOff(pFVar9);
      }
      else {
        iVar22 = pFVar9->nn + 1;
      }
      pFVar21->iEndofDoclist = iVar22;
    }
  }
  fts5SegIterReverseInitPage(pFVar23,pFVar21);
  pFVar29 = local_80;
LAB_001b6cdd:
  fts5SegIterSetNext(pFVar23,pFVar21);
  lVar15 = local_40;
  goto LAB_001b6835;
}

Assistant:

static void fts5MultiIterNew(
  Fts5Index *p,                   /* FTS5 backend to iterate within */
  Fts5Structure *pStruct,         /* Structure of specific index */
  int flags,                      /* FTS5INDEX_QUERY_XXX flags */
  Fts5Colset *pColset,            /* Colset to filter on (or NULL) */
  const u8 *pTerm, int nTerm,     /* Term to seek to (or NULL/0) */
  int iLevel,                     /* Level to iterate (-1 for all) */
  int nSegment,                   /* Number of segments to merge (iLevel>=0) */
  Fts5Iter **ppOut                /* New object */
){
  int nSeg = 0;                   /* Number of segment-iters in use */
  int iIter = 0;                  /* */
  int iSeg;                       /* Used to iterate through segments */
  Fts5StructureLevel *pLvl;
  Fts5Iter *pNew;

  assert( (pTerm==0 && nTerm==0) || iLevel<0 );

  /* Allocate space for the new multi-seg-iterator. */
  if( p->rc==SQLITE_OK ){
    if( iLevel<0 ){
      assert( pStruct->nSegment==fts5StructureCountSegments(pStruct) );
      nSeg = pStruct->nSegment;
      nSeg += (p->pHash ? 1 : 0);
    }else{
      nSeg = MIN(pStruct->aLevel[iLevel].nSeg, nSegment);
    }
  }
  *ppOut = pNew = fts5MultiIterAlloc(p, nSeg);
  if( pNew==0 ) return;
  pNew->bRev = (0!=(flags & FTS5INDEX_QUERY_DESC));
  pNew->bSkipEmpty = (0!=(flags & FTS5INDEX_QUERY_SKIPEMPTY));
  pNew->pColset = pColset;
  if( (flags & FTS5INDEX_QUERY_NOOUTPUT)==0 ){
    fts5IterSetOutputCb(&p->rc, pNew);
  }

  /* Initialize each of the component segment iterators. */
  if( p->rc==SQLITE_OK ){
    if( iLevel<0 ){
      Fts5StructureLevel *pEnd = &pStruct->aLevel[pStruct->nLevel];
      if( p->pHash ){
        /* Add a segment iterator for the current contents of the hash table. */
        Fts5SegIter *pIter = &pNew->aSeg[iIter++];
        fts5SegIterHashInit(p, pTerm, nTerm, flags, pIter);
      }
      for(pLvl=&pStruct->aLevel[0]; pLvl<pEnd; pLvl++){
        for(iSeg=pLvl->nSeg-1; iSeg>=0; iSeg--){
          Fts5StructureSegment *pSeg = &pLvl->aSeg[iSeg];
          Fts5SegIter *pIter = &pNew->aSeg[iIter++];
          if( pTerm==0 ){
            fts5SegIterInit(p, pSeg, pIter);
          }else{
            fts5SegIterSeekInit(p, pTerm, nTerm, flags, pSeg, pIter);
          }
        }
      }
    }else{
      pLvl = &pStruct->aLevel[iLevel];
      for(iSeg=nSeg-1; iSeg>=0; iSeg--){
        fts5SegIterInit(p, &pLvl->aSeg[iSeg], &pNew->aSeg[iIter++]);
      }
    }
    assert( iIter==nSeg );
  }

  /* If the above was successful, each component iterators now points 
  ** to the first entry in its segment. In this case initialize the 
  ** aFirst[] array. Or, if an error has occurred, free the iterator
  ** object and set the output variable to NULL.  */
  if( p->rc==SQLITE_OK ){
    for(iIter=pNew->nSeg-1; iIter>0; iIter--){
      int iEq;
      if( (iEq = fts5MultiIterDoCompare(pNew, iIter)) ){
        Fts5SegIter *pSeg = &pNew->aSeg[iEq];
        if( p->rc==SQLITE_OK ) pSeg->xNext(p, pSeg, 0);
        fts5MultiIterAdvanced(p, pNew, iEq, iIter);
      }
    }
    fts5MultiIterSetEof(pNew);
    fts5AssertMultiIterSetup(p, pNew);

    if( pNew->bSkipEmpty && fts5MultiIterIsEmpty(p, pNew) ){
      fts5MultiIterNext(p, pNew, 0, 0);
    }else if( pNew->base.bEof==0 ){
      Fts5SegIter *pSeg = &pNew->aSeg[pNew->aFirst[1].iFirst];
      pNew->xSetOutputs(pNew, pSeg);
    }

  }else{
    fts5MultiIterFree(pNew);
    *ppOut = 0;
  }
}